

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# respondent.c
# Opt level: O3

int nn_respondent_events(nn_sockbase *self)

{
  uint uVar1;
  
  uVar1 = nn_xrespondent_events(self);
  if (((ulong)self[0x1b].vfptr & 1) == 0) {
    uVar1 = uVar1 & 0xfffffffd;
  }
  return uVar1;
}

Assistant:

static int nn_respondent_events (struct nn_sockbase *self)
{
    int events;
    struct nn_respondent *respondent;

    respondent = nn_cont (self, struct nn_respondent, xrespondent.sockbase);

    events = nn_xrespondent_events (&respondent->xrespondent.sockbase);
    if (!(respondent->flags & NN_RESPONDENT_INPROGRESS))
        events &= ~NN_SOCKBASE_EVENT_OUT;
    return events;
}